

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O3

void __thiscall
Count_Heap<4U>::Count_Heap(Count_Heap<4U> *this,uint32_t _SIZE,uint32_t _length,uint32_t _hash_num)

{
  uint uVar1;
  Heap<4U> *this_00;
  int **ppiVar2;
  int *piVar3;
  ulong __n;
  ulong uVar4;
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00114d38;
  this->length = _length;
  this->hash_num = _hash_num;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Abstract<4U>).name,0,(char *)0x0,0x10e934);
  this_00 = (Heap<4U> *)operator_new(0x48);
  Heap<4U>::Heap(this_00,_SIZE);
  this->heap = this_00;
  uVar1 = this->hash_num;
  ppiVar2 = (int **)operator_new__((ulong)uVar1 * 8);
  this->counter = ppiVar2;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      __n = (ulong)this->length << 2;
      piVar3 = (int *)operator_new__(__n);
      this->counter[uVar4] = piVar3;
      memset(this->counter[uVar4],0,__n);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->hash_num);
  }
  return;
}

Assistant:

Count_Heap(uint32_t _SIZE, uint32_t _length, uint32_t _hash_num)
		: length(_length), hash_num(_hash_num) {
		this->name = "Count_Heap";
		heap = new Heap<DATA_LEN>(_SIZE);
		counter = new int* [hash_num];
		for (uint32_t i = 0; i < hash_num; ++i) {
			counter[i] = new int[length];
			memset(counter[i], 0, sizeof(int) * length);
		}
	}